

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

void __thiscall QTextDocument::setTextWidth(QTextDocument *this,qreal width)

{
  QDebug this_00;
  qreal this_01;
  QLoggingCategory *pQVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QDebug local_60;
  QSizeF local_58;
  QSizeF local_48;
  QArrayData *local_38 [3];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.wd = *(qreal *)(*(long *)&this->field_0x8 + 0x298);
  local_48.ht = *(qreal *)(*(long *)&this->field_0x8 + 0x2a0);
  pQVar1 = QtPrivateLogging::lcLayout();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    this_00.stream = local_60.stream;
    QVar2.m_data = (storage_type *)0x9;
    QVar2.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar2);
    QTextStream::operator<<(&(this_00.stream)->ts,(QString *)local_38);
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,0x10);
      }
    }
    if ((local_60.stream)->space == true) {
      QTextStream::operator<<(&(local_60.stream)->ts,' ');
    }
    (local_60.stream)->ref = (local_60.stream)->ref + 1;
    ::operator<<((QDebug *)&local_58.ht,&local_58);
    this_01 = local_58.ht;
    QVar3.m_data = &DAT_00000008;
    QVar3.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<((QTextStream *)this_01,(QString *)local_38);
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_58.ht + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.ht,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.ht,width);
    if (*(QTextStream *)((long)local_58.ht + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.ht,' ');
    }
    QDebug::~QDebug((QDebug *)&local_58.ht);
    QDebug::~QDebug((QDebug *)&local_58);
    QDebug::~QDebug(&local_60);
  }
  local_48.ht = -1.0;
  local_48.wd = width;
  setPageSize(this,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::setTextWidth(qreal width)
{
    Q_D(QTextDocument);
    QSizeF sz = d->pageSize;

    qCDebug(lcLayout) << "page size" << sz << "-> width" << width;
    sz.setWidth(width);
    sz.setHeight(-1);
    setPageSize(sz);
}